

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wstring.hpp
# Opt level: O1

wstring * __thiscall
msgpack::v1::adaptor::
as<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>::
operator()(wstring *__return_storage_ptr__,
          as<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
          *this,object *o)

{
  object *poVar1;
  ulong uVar2;
  undefined8 *puVar3;
  object *poVar4;
  object local_48;
  
  if ((o->super_object).type == ARRAY) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
    std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
    uVar2 = (ulong)(o->super_object).via.array.size;
    if (uVar2 != 0) {
      poVar4 = (o->super_object).via.array.ptr;
      poVar1 = poVar4 + uVar2;
      do {
        local_48.via.array.ptr = (poVar4->super_object).via.array.ptr;
        local_48.type = (poVar4->super_object).type;
        local_48._4_4_ = *(undefined4 *)&(poVar4->super_object).field_0x4;
        local_48.via.u64 = (poVar4->super_object).via.u64;
        type::detail::convert_integer_sign<wchar_t,_true>::convert((object *)&local_48);
        std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
        poVar4 = poVar4 + 1;
      } while (poVar4 < poVar1);
    }
    return __return_storage_ptr__;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__bad_cast_0015e7a8;
  __cxa_throw(puVar3,&type_error::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

std::wstring operator()(const msgpack::object& o) const {
        if (o.type != msgpack::type::ARRAY) { throw msgpack::type_error(); }
        std::wstring v;
        v.reserve(o.via.array.size);
        if (o.via.array.size > 0) {
            msgpack::object* p = o.via.array.ptr;
            msgpack::object* const pend = o.via.array.ptr + o.via.array.size;
            do {
                v.push_back(p->as<wchar_t>());
                ++p;
            } while (p < pend);
        }
        return v;
    }